

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_tables.cpp
# Opt level: O3

void __thiscall YAJLHuffmanTable::YAJLHuffmanTable(YAJLHuffmanTable *this,bitio_stream *bstream)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  long lVar2;
  
  this->tree = (HFTree *)0x0;
  this->bstream = bstream;
  sVar1 = bitio::bitio_stream::read(bstream,4,in_RDX,in_RCX);
  this->table_class = (u8)sVar1;
  sVar1 = bitio::bitio_stream::read(bstream,4,__buf,in_RCX);
  this->table_dest = (u8)sVar1;
  lVar2 = 10;
  __buf_00 = extraout_RDX;
  do {
    sVar1 = bitio::bitio_stream::read(bstream,8,__buf_00,in_RCX);
    this->ncodes[lVar2 + -10] = (u8)sVar1;
    lVar2 = lVar2 + 1;
    __buf_00 = extraout_RDX_00;
  } while (lVar2 != 0x1a);
  decode_table(this);
  return;
}

Assistant:

YAJLHuffmanTable::YAJLHuffmanTable(bitio::bitio_stream *bstream) {
    this->bstream = bstream;
    table_class = bstream->read(0x4);
    table_dest = bstream->read(0x4);

    for (int i = 0; i < 16; i++) {
        ncodes[i] = bstream->read(0x8);
    }

    decode_table();
}